

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcsFile.cpp
# Opt level: O0

bool __thiscall mcsFile::OpenFile(mcsFile *this,string *fileName)

{
  undefined8 uVar1;
  ulong uVar2;
  ostream *poVar3;
  bool bVar4;
  string *fileName_local;
  mcsFile *this_local;
  
  uVar1 = std::__cxx11::string::c_str();
  std::ifstream::open(this,uVar1,8);
  uVar2 = std::ifstream::is_open();
  bVar4 = (uVar2 & 1) != 0;
  if (bVar4) {
    this->line_num = 0;
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,"mcsFile: could not open input file ");
    poVar3 = std::operator<<(poVar3,(string *)fileName);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  return bVar4;
}

Assistant:

bool mcsFile::OpenFile(const std::string &fileName)
{
    file.open(fileName.c_str());
    if (!file.is_open()) {
        std::cerr << "mcsFile: could not open input file " << fileName << std::endl;
        return false;
    }
    line_num = 0;
    return true;
}